

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

void __thiscall
procxx::pipe_ostreambuf::pipe_ostreambuf
          (pipe_ostreambuf *this,size_t buffer_size,size_t put_back_size)

{
  pointer pcVar1;
  allocator_type local_21;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__pipe_ostreambuf_001672d8;
  this->put_back_size_ = put_back_size;
  pipe_t::pipe_t(&this->stdout_pipe_);
  std::vector<char,_std::allocator<char>_>::vector
            (&this->in_buffer_,put_back_size + buffer_size,&local_21);
  pcVar1 = (this->in_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)&this->field_0x8 = pcVar1;
  *(pointer *)&this->field_0x10 = pcVar1;
  *(pointer *)&this->field_0x18 = pcVar1;
  return;
}

Assistant:

pipe_ostreambuf(size_t buffer_size = 512, size_t put_back_size = 8)
      : put_back_size_{put_back_size}, in_buffer_(buffer_size + put_back_size) {
    auto end = &in_buffer_.back() + 1;
    setg(end, end, end);
  }